

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_tattle_global(REF_NODE ref_node,REF_INT global)

{
  uint uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  undefined8 uVar7;
  REF_INT local_from_sorted;
  uint local_24;
  
  uVar1 = ref_node_local(ref_node,(long)global,(REF_INT *)&local_24);
  if (uVar1 == 0) {
    uVar3 = 1;
  }
  else {
    uVar3 = 0;
    if (uVar1 != 5) {
      pcVar6 = "local search";
      uVar3 = 0x106;
      uVar4 = (ulong)uVar1;
LAB_0018639c:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar3,
             "ref_node_tattle_global",uVar4,pcVar6);
      return uVar1;
    }
  }
  if ((long)ref_node->max < 1) {
    uVar2 = 0xffffffff;
    uVar7 = 0;
  }
  else {
    uVar5 = 0;
    uVar4 = 0xffffffff;
    uVar7 = 0;
    do {
      if (ref_node->global[uVar5] == (long)global && -1 < ref_node->global[uVar5]) {
        if ((int)uVar7 != 0) {
          pcVar6 = "twice";
          uVar1 = 1;
          uVar3 = 0x10e;
          uVar4 = 1;
          goto LAB_0018639c;
        }
        uVar7 = 1;
        uVar4 = uVar5 & 0xffffffff;
      }
      uVar2 = (undefined4)uVar4;
      uVar5 = uVar5 + 1;
    } while ((long)ref_node->max != uVar5);
  }
  printf("%d: global %d: search%d %d exhaust%d %d\n",(ulong)(uint)ref_node->ref_mpi->id,global,uVar3
         ,(ulong)local_24,uVar7,uVar2);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_tattle_global(REF_NODE ref_node, REF_INT global) {
  REF_INT local_from_sorted;
  REF_INT local_from_exhaustive;
  REF_BOOL found_from_sorted;
  REF_BOOL found_from_exhaustive;
  REF_INT node;

  REF_STATUS ref_status;

  ref_status = ref_node_local(ref_node, global, &local_from_sorted);
  if (REF_NOT_FOUND == ref_status) {
    found_from_sorted = REF_FALSE;
  } else {
    RSS(ref_status, "local search");
    found_from_sorted = REF_TRUE;
  }

  found_from_exhaustive = REF_FALSE;
  local_from_exhaustive = REF_EMPTY;
  each_ref_node_valid_node(ref_node, node) {
    if (global == ref_node_global(ref_node, node)) {
      if (found_from_exhaustive) RSS(REF_FAILURE, "twice");
      local_from_exhaustive = node;
      found_from_exhaustive = REF_TRUE;
    }
  }

  printf("%d: global %d: search%d %d exhaust%d %d\n",
         ref_mpi_rank(ref_node_mpi(ref_node)), global, found_from_sorted,
         local_from_sorted, found_from_exhaustive, local_from_exhaustive);

  return REF_SUCCESS;
}